

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

SequenceRange
slang::ast::SequenceRange::fromSyntax
          (RangeSelectSyntax *syntax,ASTContext *context,bool allowUnbounded)

{
  ExpressionSyntax *pEVar1;
  SyntaxNode *pSVar2;
  Type *this;
  bool bVar3;
  int iVar4;
  optional<int> oVar5;
  undefined4 extraout_var;
  Diagnostic *this_00;
  char *func;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar6;
  _Storage<int,_true> _Var7;
  SourceRange SVar8;
  SequenceRange SVar9;
  SequenceRange range;
  _Storage<int,_true> local_48;
  _Storage<int,_true> _Stack_44;
  undefined1 uStack_40;
  long local_38;
  
  local_48._M_value = 1;
  uStack_40 = 0;
  pEVar1 = (syntax->left).ptr;
  if (pEVar1 != (ExpressionSyntax *)0x0) {
    oVar5 = ASTContext::evalInteger(context,pEVar1,(bitmask<slang::ast::ASTFlags>)0x200000);
    pSVar2 = &((syntax->left).ptr)->super_SyntaxNode;
    if (pSVar2 != (SyntaxNode *)0x0) {
      SVar8 = slang::syntax::SyntaxNode::sourceRange(pSVar2);
      bVar3 = ASTContext::requirePositive(context,oVar5,SVar8);
      _Var7._M_value =
           oVar5.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
           _M_payload;
      if (bVar3) {
        local_48._M_value = _Var7._M_value;
      }
      pEVar1 = (syntax->right).ptr;
      if (pEVar1 != (ExpressionSyntax *)0x0) {
        iVar4 = Expression::bind((int)pEVar1,(sockaddr *)context,
                                 (uint)allowUnbounded << 0xb | 0x240000);
        this = (((Expression *)CONCAT44(extraout_var,iVar4))->type).ptr;
        if (this == (Type *)0x0) {
          func = 
          "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
          goto LAB_00386ede;
        }
        uVar6 = extraout_RDX;
        if (this->canonical == (Type *)0x0) {
          Type::resolveCanonical(this);
          uVar6 = extraout_RDX_00;
        }
        if ((this->canonical->super_Symbol).kind == UnboundedType) goto LAB_00386e9b;
        oVar5 = ASTContext::evalInteger(context,(Expression *)CONCAT44(extraout_var,iVar4));
        pSVar2 = &((syntax->right).ptr)->super_SyntaxNode;
        if (pSVar2 != (SyntaxNode *)0x0) {
          SVar8 = slang::syntax::SyntaxNode::sourceRange(pSVar2);
          bVar3 = ASTContext::requirePositive(context,oVar5,SVar8);
          uVar6 = extraout_RDX_01;
          if (!bVar3) {
LAB_00386e9b:
            SVar9.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload =
                 (_Storage<unsigned_int,_true>)_Stack_44._M_value;
            SVar9.min = local_48._M_value;
            SVar9.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._4_4_ =
                 (undefined4)CONCAT71((int7)((ulong)uVar6 >> 8),uStack_40);
            return SVar9;
          }
          _Stack_44._M_value =
               oVar5.super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>._M_payload;
          uStack_40 = 1;
          if (_Var7._M_value <= _Stack_44._M_value) goto LAB_00386e9b;
          pSVar2 = &((syntax->left).ptr)->super_SyntaxNode;
          if (pSVar2 != (SyntaxNode *)0x0) {
            SVar8 = slang::syntax::SyntaxNode::sourceRange(pSVar2);
            this_00 = ASTContext::addDiag(context,(DiagCode)0x400008,SVar8);
            pSVar2 = &((syntax->right).ptr)->super_SyntaxNode;
            if (pSVar2 != (SyntaxNode *)0x0) {
              SVar8 = slang::syntax::SyntaxNode::sourceRange(pSVar2);
              Diagnostic::operator<<(this_00,SVar8);
              local_38 = (long)_Var7._M_value;
              std::
              vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
              ::emplace_back<long>(&this_00->args,&local_38);
              local_38 = (long)_Stack_44._M_value;
              std::
              vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
              ::emplace_back<long>(&this_00->args,&local_38);
              uVar6 = extraout_RDX_02;
              goto LAB_00386e9b;
            }
          }
        }
      }
    }
  }
  func = 
  "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
  ;
LAB_00386ede:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

SequenceRange SequenceRange::fromSyntax(const RangeSelectSyntax& syntax, const ASTContext& context,
                                        bool allowUnbounded) {
    SequenceRange range;
    auto l = context.evalInteger(*syntax.left, ASTFlags::AssertionDelayOrRepetition);
    if (context.requirePositive(l, syntax.left->sourceRange()))
        range.min = uint32_t(*l);

    // The rhs can be an unbounded '$' so we need extra AST flags.
    bitmask<ASTFlags> flags = ASTFlags::AssertionExpr | ASTFlags::AssertionDelayOrRepetition;
    if (allowUnbounded)
        flags |= ASTFlags::AllowUnboundedLiteral;

    auto& re = Expression::bind(*syntax.right, context, flags);
    if (re.type->isUnbounded())
        return range;

    auto r = context.evalInteger(re);
    if (context.requirePositive(r, syntax.right->sourceRange())) {
        range.max = uint32_t(*r);
        if (*l > *r) {
            auto& diag = context.addDiag(diag::SeqRangeMinMax, syntax.left->sourceRange());
            diag << syntax.right->sourceRange();
            diag << *l << *r;
        }
    }

    return range;
}